

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QModelIndex>::moveAppend
          (QGenericArrayOps<QModelIndex> *this,QModelIndex *b,QModelIndex *e)

{
  undefined8 uVar1;
  QModelIndex *pQVar2;
  QModelIndex *pQVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  QModelIndex *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar2 = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x8ec567);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pQVar3 = pQVar2 + *(long *)(in_RDI + 0x10);
      uVar1 = *local_10;
      pQVar3->r = (int)uVar1;
      pQVar3->c = (int)((ulong)uVar1 >> 0x20);
      pQVar3->i = local_10[1];
      (pQVar3->m).ptr = (QAbstractItemModel *)local_10[2];
      local_10 = local_10 + 3;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }